

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitallocator.cpp
# Opt level: O0

Error __thiscall asmjit::v1_14::JitAllocator::alloc(JitAllocator *this,Span *out,size_t size)

{
  JitAllocatorPrivateImpl *impl_00;
  JitAllocatorBlock *pJVar1;
  bool bVar2;
  uint uVar3;
  Error EVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  ulong uVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  uint8_t *puVar11;
  long in_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  size_t offset;
  Error _err;
  size_t blockSize;
  size_t searchEnd;
  size_t rangeSize;
  size_t largestArea;
  size_t searchStart;
  size_t rangeEnd;
  size_t rangeStart;
  BitVectorRangeIterator<unsigned_long,_0U> it;
  JitAllocatorBlock *next;
  JitAllocatorBlock *initial;
  JitAllocatorBlock *block;
  uint32_t areaSize;
  uint32_t areaIndex;
  JitAllocatorPool *pool;
  LockGuard guard;
  uint32_t kNoIndex;
  JitAllocatorPrivateImpl *impl;
  char *in_stack_00000240;
  int in_stack_0000024c;
  char *in_stack_00000250;
  size_t in_stack_fffffffffffffe48;
  size_t in_stack_fffffffffffffe50;
  JitAllocatorBlock *in_stack_fffffffffffffe58;
  JitAllocatorPrivateImpl *in_stack_fffffffffffffe60;
  JitAllocatorPool *in_stack_fffffffffffffe68;
  JitAllocatorBlock *in_stack_fffffffffffffe70;
  JitAllocatorBlock *local_188;
  JitAllocatorBlock *local_148;
  JitAllocatorBlock *local_140;
  JitAllocatorPrivateImpl *local_138;
  ulong local_130;
  JitAllocatorPrivateImpl *local_128;
  BitVectorRangeIterator<unsigned_long,_0U> local_120;
  JitAllocatorBlock *local_100;
  JitAllocatorBlock *local_f8;
  JitAllocatorBlock *local_f0;
  uint32_t areaSize_00;
  JitAllocatorPool *pJVar12;
  pthread_mutex_t *__mutex;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 uVar13;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined4 local_a0;
  undefined4 local_9c;
  ulong local_98;
  undefined8 *local_90;
  Error local_7c;
  JitAllocatorPool *local_78;
  JitAllocatorPool *local_70;
  ZoneListNode<asmjit::v1_14::JitAllocatorBlock> *local_68;
  Lock *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  uint local_44;
  long local_40;
  ZoneListNode<asmjit::v1_14::JitAllocatorBlock> *local_38;
  JitAllocatorPrivateImpl **local_30;
  JitAllocatorPrivateImpl **local_28;
  JitAllocatorBlock **local_20;
  JitAllocatorBlock **local_18;
  Lock *local_10;
  
  local_c0 = 0;
  local_b8 = 0;
  local_b0 = 0;
  local_a8 = 0;
  local_a0 = 0;
  local_9c = 0;
  local_98 = in_RDX;
  local_90 = in_RSI;
  memcpy(in_RSI,&local_c0,0x28);
  if ((undefined1 *)*in_RDI == JitAllocatorImpl_none) {
    EVar4 = DebugUtils::errored(5);
    return EVar4;
  }
  impl_00 = (JitAllocatorPrivateImpl *)*in_RDI;
  uVar13 = 0xffffffff;
  local_44 = (impl_00->super_Impl).granularity;
  local_40 = local_98;
  uVar7 = local_98 + ((ulong)local_44 - 1) & ((ulong)local_44 - 1 ^ 0xffffffffffffffff);
  local_98 = uVar7;
  if (uVar7 == 0) {
    EVar4 = DebugUtils::errored(2);
    return EVar4;
  }
  uVar3 = std::numeric_limits<unsigned_int>::max();
  if (uVar3 >> 1 < uVar7) {
    EVar4 = DebugUtils::errored(9);
    return EVar4;
  }
  __mutex = (pthread_mutex_t *)&impl_00->lock;
  local_58 = &stack0xffffffffffffff28;
  local_60 = (Lock *)__mutex;
  local_10 = (Lock *)__mutex;
  pthread_mutex_lock(__mutex);
  pJVar12 = impl_00->pools;
  sVar8 = JitAllocatorImpl_sizeToPoolId(impl_00,local_98);
  pJVar12 = pJVar12 + sVar8;
  areaSize_00 = 0xffffffff;
  uVar5 = JitAllocatorPool::areaSizeFromByteSize(pJVar12,local_98);
  local_f0 = *(JitAllocatorBlock **)pJVar12;
  pJVar1 = local_f0;
  local_70 = pJVar12;
  if (local_f0 != (JitAllocatorBlock *)0x0) {
    do {
      local_f8 = pJVar1;
      local_38 = &local_f0->super_ZoneListNode<asmjit::v1_14::JitAllocatorBlock>;
      if (*(long *)&local_f0->field_0x18 == 0) {
        local_188 = *(JitAllocatorBlock **)pJVar12;
        local_78 = pJVar12;
      }
      else {
        local_68 = &local_f0->super_ZoneListNode<asmjit::v1_14::JitAllocatorBlock>;
        local_188 = *(JitAllocatorBlock **)&local_f0->field_0x18;
      }
      local_100 = local_188;
      uVar6 = JitAllocatorBlock::areaAvailable(local_f0);
      if ((uVar5 <= uVar6) &&
         ((bVar2 = JitAllocatorBlock::isDirty((JitAllocatorBlock *)0x14418d), bVar2 ||
          (uVar6 = JitAllocatorBlock::largestUnusedArea(local_f0), uVar5 <= uVar6)))) {
        in_stack_fffffffffffffe68 = pJVar12;
        in_stack_fffffffffffffe70 = (JitAllocatorBlock *)local_f0->_usedBitVector;
        pJVar12 = in_stack_fffffffffffffe68;
        uVar6 = JitAllocatorBlock::areaSize(local_f0);
        JitAllocatorPool::bitWordCountFromAreaSize(in_stack_fffffffffffffe68,uVar6);
        BitVectorRangeIterator<unsigned_long,_0U>::BitVectorRangeIterator
                  ((BitVectorRangeIterator<unsigned_long,_0U> *)in_stack_fffffffffffffe60,
                   (unsigned_long *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                   in_stack_fffffffffffffe48,0x144212);
        local_128 = (JitAllocatorPrivateImpl *)0x0;
        uVar6 = JitAllocatorBlock::areaSize(local_f0);
        local_130 = (ulong)uVar6;
        local_138 = (JitAllocatorPrivateImpl *)0xffffffffffffffff;
        local_140 = (JitAllocatorBlock *)0x0;
        while (bVar2 = BitVectorRangeIterator<unsigned_long,_0U>::nextRange
                                 (&local_120,(size_t *)&local_128,&local_130,(ulong)uVar5), bVar2) {
          local_148 = (JitAllocatorBlock *)(local_130 - (long)local_128);
          if ((JitAllocatorBlock *)(ulong)uVar5 <= local_148) {
            areaSize_00 = (uint32_t)local_128;
            break;
          }
          local_28 = &local_138;
          local_30 = &local_128;
          in_stack_fffffffffffffe60 = local_138;
          if (local_128 < local_138) {
            in_stack_fffffffffffffe60 = local_128;
          }
          local_18 = &local_140;
          local_20 = &local_148;
          in_stack_fffffffffffffe58 = local_140;
          local_138 = in_stack_fffffffffffffe60;
          if (local_140 < local_148) {
            in_stack_fffffffffffffe58 = local_148;
            local_140 = local_148;
          }
        }
        if (areaSize_00 != 0xffffffff) break;
        if (local_138 != (JitAllocatorPrivateImpl *)0xffffffffffffffff) {
          local_f0->_searchStart = (uint32_t)local_138;
          local_f0->_searchEnd = (uint32_t)local_130;
          local_f0->_largestUnusedArea = (uint32_t)local_140;
          JitAllocatorBlock::clearFlags(local_f0,4);
        }
      }
      local_f0 = local_100;
      pJVar1 = local_f8;
    } while (local_100 != local_f8);
  }
  if (areaSize_00 == 0xffffffff) {
    sVar8 = JitAllocatorImpl_calculateIdealBlockSize
                      ((JitAllocatorPrivateImpl *)in_stack_fffffffffffffe70,
                       in_stack_fffffffffffffe68,(size_t)in_stack_fffffffffffffe60);
    if (sVar8 == 0) {
      local_7c = DebugUtils::errored(1);
      goto LAB_00144684;
    }
    local_7c = JitAllocatorImpl_newBlock
                         ((JitAllocatorPrivateImpl *)CONCAT44(uVar13,in_stack_ffffffffffffff30),
                          (JitAllocatorBlock **)&__mutex->__align,pJVar12,
                          CONCAT44(areaSize_00,uVar5));
    if (local_7c != 0) goto LAB_00144684;
    areaSize_00 = JitAllocatorBlock::initialAreaStart((JitAllocatorBlock *)0x1444e1);
    JitAllocatorImpl_insertBlock(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    local_f0->_searchStart = uVar5 + local_f0->_searchStart;
    local_f0->_largestUnusedArea = local_f0->_largestUnusedArea - uVar5;
  }
  else {
    bVar2 = JitAllocatorBlock::hasFlag(local_f0,2);
    if (bVar2) {
      pJVar12->emptyBlockCount = pJVar12->emptyBlockCount + 0xff;
      JitAllocatorBlock::clearFlags(local_f0,2);
    }
  }
  impl_00->allocationCount = impl_00->allocationCount + 1;
  JitAllocatorBlock::markAllocatedArea
            (in_stack_fffffffffffffe70,(uint32_t)((ulong)in_stack_fffffffffffffe68 >> 0x20),
             (uint32_t)in_stack_fffffffffffffe68);
  sVar9 = JitAllocatorPool::byteSizeFromAreaSize(pJVar12,areaSize_00);
  sVar8 = sVar9;
  sVar10 = JitAllocatorBlock::blockSize(local_f0);
  if (sVar10 - local_98 < sVar8) {
    DebugUtils::assertionFailed(in_stack_00000250,in_stack_0000024c,in_stack_00000240);
  }
  puVar11 = JitAllocatorBlock::rxPtr(local_f0);
  *local_90 = puVar11 + sVar9;
  puVar11 = JitAllocatorBlock::rwPtr(local_f0);
  local_90[1] = puVar11 + sVar9;
  local_90[2] = local_98;
  local_90[3] = local_f0;
  local_7c = 0;
LAB_00144684:
  local_50 = &stack0xffffffffffffff28;
  pthread_mutex_unlock(__mutex);
  return local_7c;
}

Assistant:

Error JitAllocator::alloc(Span& out, size_t size) noexcept {
  out = Span{};

  if (ASMJIT_UNLIKELY(_impl == &JitAllocatorImpl_none))
    return DebugUtils::errored(kErrorNotInitialized);

  JitAllocatorPrivateImpl* impl = static_cast<JitAllocatorPrivateImpl*>(_impl);
  constexpr uint32_t kNoIndex = std::numeric_limits<uint32_t>::max();

  // Align to the minimum granularity by default.
  size = Support::alignUp<size_t>(size, impl->granularity);
  if (ASMJIT_UNLIKELY(size == 0))
    return DebugUtils::errored(kErrorInvalidArgument);

  if (ASMJIT_UNLIKELY(size > std::numeric_limits<uint32_t>::max() / 2))
    return DebugUtils::errored(kErrorTooLarge);

  LockGuard guard(impl->lock);
  JitAllocatorPool* pool = &impl->pools[JitAllocatorImpl_sizeToPoolId(impl, size)];

  uint32_t areaIndex = kNoIndex;
  uint32_t areaSize = uint32_t(pool->areaSizeFromByteSize(size));

  // Try to find the requested memory area in existing blocks.
  JitAllocatorBlock* block = pool->blocks.first();
  if (block) {
    JitAllocatorBlock* initial = block;
    do {
      JitAllocatorBlock* next = block->hasNext() ? block->next() : pool->blocks.first();
      if (block->areaAvailable() >= areaSize) {
        if (block->isDirty() || block->largestUnusedArea() >= areaSize) {
          BitVectorRangeIterator<Support::BitWord, 0> it(block->_usedBitVector, pool->bitWordCountFromAreaSize(block->areaSize()), block->_searchStart, block->_searchEnd);

          size_t rangeStart = 0;
          size_t rangeEnd = block->areaSize();

          size_t searchStart = SIZE_MAX;
          size_t largestArea = 0;

          while (it.nextRange(&rangeStart, &rangeEnd, areaSize)) {
            size_t rangeSize = rangeEnd - rangeStart;
            if (rangeSize >= areaSize) {
              areaIndex = uint32_t(rangeStart);
              break;
            }

            searchStart = Support::min(searchStart, rangeStart);
            largestArea = Support::max(largestArea, rangeSize);
          }

          if (areaIndex != kNoIndex)
            break;

          if (searchStart != SIZE_MAX) {
            // Because we have iterated over the entire block, we can now mark the
            // largest unused area that can be used to cache the next traversal.
            size_t searchEnd = rangeEnd;

            block->_searchStart = uint32_t(searchStart);
            block->_searchEnd = uint32_t(searchEnd);
            block->_largestUnusedArea = uint32_t(largestArea);
            block->clearFlags(JitAllocatorBlock::kFlagDirty);
          }
        }
      }

      block = next;
    } while (block != initial);
  }

  // Allocate a new block if there is no region of a required size.
  if (areaIndex == kNoIndex) {
    size_t blockSize = JitAllocatorImpl_calculateIdealBlockSize(impl, pool, size);
    if (ASMJIT_UNLIKELY(!blockSize))
      return DebugUtils::errored(kErrorOutOfMemory);

    ASMJIT_PROPAGATE(JitAllocatorImpl_newBlock(impl, &block, pool, blockSize));
    areaIndex = block->initialAreaStart();

    JitAllocatorImpl_insertBlock(impl, block);
    block->_searchStart += areaSize;
    block->_largestUnusedArea -= areaSize;
  }
  else if (block->hasFlag(JitAllocatorBlock::kFlagEmpty)) {
    pool->emptyBlockCount--;
    block->clearFlags(JitAllocatorBlock::kFlagEmpty);
  }

  // Update statistics.
  impl->allocationCount++;
  block->markAllocatedArea(areaIndex, areaIndex + areaSize);

  // Return a span referencing the allocated memory.
  size_t offset = pool->byteSizeFromAreaSize(areaIndex);
  ASMJIT_ASSERT(offset <= block->blockSize() - size);

  out._rx = block->rxPtr() + offset;
  out._rw = block->rwPtr() + offset;
  out._size = size;
  out._block = static_cast<void*>(block);

  return kErrorOk;
}